

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_cid.c
# Opt level: O0

void promote_cid(quicly_remote_cid_set_t *set,size_t idx_to_promote)

{
  undefined8 uVar1;
  long in_RSI;
  int *in_RDI;
  uint64_t seq_tmp;
  
  uVar1 = *(undefined8 *)(in_RDI + 2);
  if (in_RSI == 0) {
    __assert_fail("idx_to_promote > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/remote_cid.c"
                  ,0x39,"void promote_cid(quicly_remote_cid_set_t *, size_t)");
  }
  if (*in_RDI == 0) {
    memcpy(in_RDI,in_RDI + in_RSI * 0xe,0x38);
    in_RDI[in_RSI * 0xe] = 0;
    *(undefined8 *)(in_RDI + in_RSI * 0xe + 2) = uVar1;
    return;
  }
  __assert_fail("!set->cids[0].is_active",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/remote_cid.c"
                ,0x3a,"void promote_cid(quicly_remote_cid_set_t *, size_t)");
}

Assistant:

static void promote_cid(quicly_remote_cid_set_t *set, size_t idx_to_promote)
{
    uint64_t seq_tmp = set->cids[0].sequence;

    assert(idx_to_promote > 0);
    assert(!set->cids[0].is_active);

    set->cids[0] = set->cids[idx_to_promote];
    set->cids[idx_to_promote].is_active = 0;
    set->cids[idx_to_promote].sequence = seq_tmp;
}